

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrapTCPService.cpp
# Opt level: O2

PTR brynet::net::TCPSession::Create(void)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  PTR PVar2;
  __allocator_type __a2;
  allocator<std::_Sp_counted_ptr_inplace<make_shared_enabler,_std::allocator<make_shared_enabler>,_(__gnu_cxx::_Lock_policy)2>_>
  local_49;
  undefined8 local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<make_shared_enabler,_std::allocator<make_shared_enabler>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_38;
  
  peVar1 = (element_type *)operator_new(0xb0);
  local_38._M_alloc = &local_49;
  (peVar1->super_enable_shared_from_this<brynet::net::TcpService>)._M_weak_this.
  super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar1->_vptr_TcpService = (_func_int **)&PTR___Sp_counted_ptr_inplace_00154e40;
  this = &(peVar1->super_enable_shared_from_this<brynet::net::TcpService>)._M_weak_this.
          super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  memset(this,0,0xa0);
  TCPSession((TCPSession *)this);
  (peVar1->super_enable_shared_from_this<brynet::net::TcpService>)._M_weak_this.
  super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__TCPSession_00154e90;
  local_38._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<make_shared_enabler,_std::allocator<make_shared_enabler>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_38);
  in_RDI->_vptr_TCPSession = (_func_int **)this;
  local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (in_RDI->mService).super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar1;
  local_48 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  PVar2.super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar2.super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (PTR)PVar2.super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TCPSession::PTR TCPSession::Create()
{
    struct make_shared_enabler : public TCPSession {};
    return std::make_shared<make_shared_enabler>();
}